

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

HandshakeResult __thiscall
tonk::Connection::OnUnauthenticatedHandshake(Connection *this,uint8_t *data,uint bytes)

{
  bool bVar1;
  long lVar2;
  RefCounter *this_00;
  ErrorResult *pEVar3;
  uint64_t uVar4;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  uint64_t key_1;
  uint64_t key;
  HandshakeType type;
  uint8_t *handshakeData;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_3;
  char *in_stack_fffffffffffff468;
  SessionIncoming *in_stack_fffffffffffff470;
  atomic<bool> *in_stack_fffffffffffff478;
  ErrorType type_00;
  SessionOutgoing *in_stack_fffffffffffff480;
  undefined1 *puVar5;
  char *in_stack_fffffffffffff488;
  ErrorResult *in_stack_fffffffffffff490;
  LogStringBuffer *in_stack_fffffffffffff4a8;
  Result *result;
  OutputWorker *in_stack_fffffffffffff4b0;
  uint64_t in_stack_fffffffffffff4c8;
  allocator local_a89;
  string local_a88 [32];
  Result local_a68 [3];
  string local_a50 [32];
  uint64_t local_a30;
  HandshakeType local_a24;
  uint8_t *local_a20;
  HandshakeResult local_a00;
  undefined8 local_9f0;
  undefined4 local_9e4;
  string *local_9e0;
  char *local_9d8;
  Result *local_9d0;
  char *local_9c8;
  long local_9c0;
  char *local_9b8;
  long local_9b0;
  string *local_9a8;
  char *local_9a0;
  long local_998;
  char *local_990;
  long local_988;
  char *local_980;
  undefined4 local_974;
  long local_970;
  undefined4 local_964;
  long local_960;
  undefined1 local_948 [16];
  ostream aoStack_938 [376];
  char *local_7c0;
  undefined4 local_7b4;
  long local_7b0;
  char *local_7a8;
  string *local_7a0;
  undefined1 *local_798;
  long local_790;
  string *local_788;
  undefined1 *local_780;
  long local_778;
  string *local_770;
  undefined1 *local_768;
  char *local_760;
  undefined1 *local_758;
  long local_750;
  char *local_748;
  undefined1 *local_740;
  char *local_738;
  undefined4 local_72c;
  long local_728;
  undefined4 local_71c;
  long local_718;
  undefined1 local_700 [16];
  ostream aoStack_6f0 [376];
  char *local_578;
  undefined4 local_56c;
  long local_568;
  char *local_560;
  string *local_558;
  undefined1 *local_550;
  long local_548;
  string *local_540;
  undefined1 *local_538;
  long local_530;
  string *local_528;
  undefined1 *local_520;
  char *local_518;
  undefined1 *local_510;
  long local_508;
  char *local_500;
  undefined1 *local_4f8;
  string *local_4f0;
  char *local_4e8;
  undefined4 local_4dc;
  long local_4d8;
  undefined4 local_4cc;
  long local_4c8;
  undefined1 local_4b0 [16];
  ostream aoStack_4a0 [376];
  string *local_328;
  char *local_320;
  undefined4 local_314;
  long local_310;
  string *local_308;
  char *local_300;
  string *local_2f8;
  undefined1 *local_2f0;
  long local_2e8;
  string *local_2e0;
  undefined1 *local_2d8;
  long local_2d0;
  string *local_2c8;
  undefined1 *local_2c0;
  string *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  long local_2a0;
  string *local_298;
  undefined1 *local_290;
  long local_288;
  string *local_280;
  undefined1 *local_278;
  char *local_270;
  undefined1 *local_268;
  long local_260;
  char *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined1 local_210 [392];
  char *local_88;
  undefined4 local_7c;
  long local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  long local_58;
  string *local_50;
  undefined1 *local_48;
  long local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  long local_18;
  char *local_10;
  undefined1 *local_8;
  
  if (in_EDX < 0x12) {
    local_a00 = DropDatagram;
  }
  else {
    local_a20 = (uint8_t *)(in_RSI + (ulong)in_EDX + -0x12);
    local_a24 = protocol::handshake::GetType(local_a20);
    if (local_a24 == HandshakeType_S2CUnknownSourceAddress) {
      lVar2 = in_RDI + 0x110;
      local_9b8 = "Server did not recognize our source address";
      local_72c = 1;
      local_738 = "Server did not recognize our source address";
      local_71c = 1;
      local_9b0 = lVar2;
      local_728 = lVar2;
      local_718 = lVar2;
      if (*(int *)(in_RDI + 0x118) < 2) {
        local_56c = 1;
        local_578 = "Server did not recognize our source address";
        local_568 = lVar2;
        logger::LogStringBuffer::LogStringBuffer
                  ((LogStringBuffer *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,Trace);
        local_558 = (string *)(in_RDI + 0x148);
        local_560 = local_578;
        local_550 = local_700;
        local_548 = lVar2;
        local_540 = local_558;
        local_538 = local_700;
        local_530 = lVar2;
        local_528 = local_558;
        local_520 = local_700;
        std::operator<<(aoStack_6f0,local_558);
        local_510 = local_550;
        local_518 = local_560;
        local_4f8 = local_550;
        local_500 = local_560;
        local_508 = lVar2;
        std::operator<<((ostream *)(local_550 + 0x10),local_560);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x13c60f);
      }
      if (*(int *)(in_RDI + 0xc904) != 0x7fffffff) {
        SessionOutgoing::StartHandshakeC2SUpdateSourceAddress
                  (in_stack_fffffffffffff480,(uint64_t)in_stack_fffffffffffff478,
                   (uint32_t)((ulong)in_stack_fffffffffffff470 >> 0x20));
      }
      local_a00 = DropDatagram;
    }
    else if (local_a24 == HandshakeType_Disconnect) {
      local_a30 = protocol::handshake::GetKey(local_a20);
      if (local_a30 == *(uint64_t *)(in_RDI + 0xc8f8)) {
        bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffff478);
        type_00 = (ErrorType)((ulong)in_stack_fffffffffffff478 >> 0x20);
        if (bVar1) {
          lVar2 = in_RDI + 0x110;
          local_9c8 = "Ignoring handshake disconnect after connection established";
          local_974 = 3;
          local_980 = "Ignoring handshake disconnect after connection established";
          local_964 = 3;
          if (*(int *)(in_RDI + 0x118) < 4) {
            local_7b4 = 3;
            local_7c0 = "Ignoring handshake disconnect after connection established";
            local_9c0 = lVar2;
            local_970 = lVar2;
            local_960 = lVar2;
            local_7b0 = lVar2;
            logger::LogStringBuffer::LogStringBuffer
                      ((LogStringBuffer *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,Trace)
            ;
            local_7a0 = (string *)(in_RDI + 0x148);
            local_7a8 = local_7c0;
            local_798 = local_948;
            local_790 = lVar2;
            local_788 = local_7a0;
            local_780 = local_948;
            local_778 = lVar2;
            local_770 = local_7a0;
            local_768 = local_948;
            std::operator<<(aoStack_938,local_7a0);
            local_758 = local_798;
            local_760 = local_7a8;
            local_740 = local_798;
            local_748 = local_7a8;
            local_750 = lVar2;
            std::operator<<((ostream *)(local_798 + 0x10),local_7a8);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x13cd0e);
          }
          local_a00 = DropDatagram;
        }
        else {
          this_00 = (RefCounter *)(in_RDI + 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_a88,"Connection rejected by peer (server full?)",&local_a89);
          result = local_a68;
          local_9d8 = "Disconnected";
          local_9e0 = local_a88;
          local_9e4 = 0;
          local_9f0 = 10;
          local_9d0 = result;
          pEVar3 = (ErrorResult *)operator_new(0x38);
          ErrorResult::ErrorResult
                    (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                     (string *)in_stack_fffffffffffff480,type_00,
                     (ErrorCodeT)in_stack_fffffffffffff470);
          result->Error = pEVar3;
          RefCounter::StartShutdown(this_00,(uint)((ulong)pEVar3 >> 0x20),result);
          Result::~Result((Result *)in_stack_fffffffffffff470);
          std::__cxx11::string::~string(local_a88);
          std::allocator<char>::~allocator((allocator<char> *)&local_a89);
          local_a00 = DropDatagram;
        }
      }
      else {
        lVar2 = in_RDI + 0x110;
        HexString_abi_cxx11_(in_stack_fffffffffffff4c8);
        local_9a0 = "Ignoring disconnect with wrong key = ";
        local_9a8 = local_a50;
        local_4dc = 3;
        local_4e8 = "Ignoring disconnect with wrong key = ";
        local_4cc = 3;
        local_998 = lVar2;
        local_4f0 = local_9a8;
        local_4d8 = lVar2;
        local_4c8 = lVar2;
        if (*(int *)(in_RDI + 0x118) < 4) {
          local_314 = 3;
          local_320 = "Ignoring disconnect with wrong key = ";
          local_328 = local_9a8;
          local_310 = lVar2;
          logger::LogStringBuffer::LogStringBuffer
                    ((LogStringBuffer *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,Trace);
          local_2f8 = (string *)(in_RDI + 0x148);
          local_2f0 = local_4b0;
          local_300 = local_320;
          local_308 = local_328;
          local_2e8 = lVar2;
          local_2e0 = local_2f8;
          local_2d8 = local_2f0;
          local_2d0 = lVar2;
          local_2c8 = local_2f8;
          local_2c0 = local_2f0;
          std::operator<<(aoStack_4a0,local_2f8);
          local_2a8 = local_2f0;
          local_2b0 = local_300;
          local_2b8 = local_308;
          local_268 = local_2f0;
          local_270 = local_300;
          local_250 = local_2f0;
          local_258 = local_300;
          local_2a0 = lVar2;
          local_260 = lVar2;
          std::operator<<((ostream *)(local_2f0 + 0x10),local_300);
          local_290 = local_2a8;
          local_298 = local_2b8;
          local_278 = local_2a8;
          local_280 = local_2b8;
          local_288 = lVar2;
          std::operator<<((ostream *)(local_2a8 + 0x10),local_2b8);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x13ca29);
        }
        std::__cxx11::string::~string(local_a50);
        local_a00 = DropDatagram;
      }
    }
    else if (local_a24 == HandshakeType_S2CCookieResponse) {
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffff478);
      if (bVar1) {
        lVar2 = in_RDI + 0x110;
        local_990 = "Ignoring S2C cookie response after connection established";
        local_23c = 3;
        local_248 = "Ignoring S2C cookie response after connection established";
        local_22c = 3;
        if (*(int *)(in_RDI + 0x118) < 4) {
          local_7c = 3;
          local_88 = "Ignoring S2C cookie response after connection established";
          puVar5 = local_210;
          local_988 = lVar2;
          local_238 = lVar2;
          local_228 = lVar2;
          local_78 = lVar2;
          logger::LogStringBuffer::LogStringBuffer
                    ((LogStringBuffer *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,Trace);
          local_68 = (string *)(lVar2 + 0x38);
          local_70 = local_88;
          local_60 = puVar5;
          local_58 = lVar2;
          local_50 = local_68;
          local_48 = puVar5;
          local_40 = lVar2;
          local_38 = local_68;
          local_30 = puVar5;
          std::operator<<((ostream *)(puVar5 + 0x10),local_68);
          local_20 = local_60;
          local_28 = local_70;
          local_8 = local_60;
          local_10 = local_70;
          local_18 = lVar2;
          std::operator<<((ostream *)(local_60 + 0x10),local_70);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x13d187);
        }
        local_a00 = DropDatagram;
      }
      else {
        uVar4 = protocol::handshake::GetKey(local_a20);
        *(uint64_t *)(in_RDI + 0xc8f8) = uVar4;
        SessionOutgoing::ChangeEncryptionKey
                  ((SessionOutgoing *)in_stack_fffffffffffff470,(uint64_t)in_stack_fffffffffffff468)
        ;
        SessionIncoming::ChangeEncryptionKey
                  (in_stack_fffffffffffff470,(uint64_t)in_stack_fffffffffffff468);
        SessionOutgoing::StartHandshakeC2SConnect
                  ((SessionOutgoing *)in_stack_fffffffffffff470,(uint64_t)in_stack_fffffffffffff468)
        ;
        local_a00 = DropDatagram;
      }
    }
    else {
      local_a00 = ContinueProcessing;
    }
  }
  return local_a00;
}

Assistant:

HandshakeResult Connection::OnUnauthenticatedHandshake(const uint8_t* data, const unsigned bytes)
{
    /*
        Note that all of this processing is not from authenticated data so
        it could have come from anywhere.  The impact of processing this
        data should be minimal and restricted mainly to cases where the
        peer is not reachable or connection handshake is ongoing.
    */

    static const unsigned kHandshakeRightOffset = protocol::kUntaggedDatagramBytes + protocol::kHandshakeBytes;
    if (bytes < kHandshakeRightOffset)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return HandshakeResult::DropDatagram;
    }
    const uint8_t* handshakeData = data + bytes - kHandshakeRightOffset;
    const protocol::HandshakeType type = protocol::handshake::GetType(handshakeData);

    if (type == protocol::HandshakeType_S2CUnknownSourceAddress)
    {
        Logger.Debug("Server did not recognize our source address");

        /*
            Server did not recognize our source address.  This happens if we
            changed IP source address or source port without realizing it.
            This can happen in practice if a mobile device is rehoming under
            a new NAT address.  We will need to start attaching our Connection
            Id to outgoing datagrams.
        */
        if (RemoteAssignedIdForLocalHost != TONK_INVALID_ID)
        {
            Outgoing.StartHandshakeC2SUpdateSourceAddress(
                EncryptionKey,
                RemoteAssignedIdForLocalHost);
        }
        return HandshakeResult::DropDatagram;
    }

    if (type == protocol::HandshakeType_Disconnect)
    {
        const uint64_t key = protocol::handshake::GetKey(handshakeData);
        if (key != EncryptionKey)
        {
            Logger.Warning("Ignoring disconnect with wrong key = ", HexString(key));
            return HandshakeResult::DropDatagram;
        }

        if (ConnectionEstablished)
        {
            Logger.Warning("Ignoring handshake disconnect after connection established");
            return HandshakeResult::DropDatagram;
        }

        SelfRefCount.StartShutdown(
            Tonk_ConnectionRejected,
            Result("Disconnected",
                "Connection rejected by peer (server full?)",
                ErrorType::Tonk,
                Tonk_ConnectionRejected));
        return HandshakeResult::DropDatagram;
    }

    if (type == protocol::HandshakeType_S2CCookieResponse)
    {
        if (ConnectionEstablished)
        {
            Logger.Warning("Ignoring S2C cookie response after connection established");
            return HandshakeResult::DropDatagram;
        }

        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        // Update our encryption key to match
        EncryptionKey = key;
        Outgoing.ChangeEncryptionKey(key);
        Incoming.ChangeEncryptionKey(key);

        // Start attaching new handshake to each outgoing datagram
        Outgoing.StartHandshakeC2SConnect(key);

        // Cookie responses contain no other data
        return HandshakeResult::DropDatagram;
    }

    // Ignore other types
    return HandshakeResult::ContinueProcessing;
}